

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_3x3_pack1to4.h
# Opt level: O1

void ncnn::conv3x3s1_pack1to4_sse(Mat *bottom_blob,Mat *top_blob,Mat *kernel,Mat *_bias,Option *opt)

{
  undefined1 (*pauVar1) [12];
  undefined1 (*pauVar2) [16];
  float *pfVar3;
  float *pfVar4;
  long lVar5;
  void *pvVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  uint uVar20;
  uint uVar21;
  int iVar22;
  int iVar23;
  void *pvVar24;
  size_t sVar25;
  void *pvVar26;
  size_t sVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  undefined8 uVar42;
  undefined8 uVar43;
  undefined1 auVar44 [12];
  undefined1 auVar45 [12];
  undefined1 auVar46 [12];
  undefined1 auVar47 [12];
  undefined1 auVar48 [16];
  undefined1 auVar49 [12];
  undefined1 auVar50 [12];
  uint uVar51;
  void *pvVar52;
  ulong uVar53;
  uint uVar54;
  long lVar55;
  void *pvVar56;
  int iVar57;
  int iVar58;
  long lVar59;
  long lVar60;
  long lVar61;
  void *pvVar62;
  void *pvVar63;
  void *pvVar64;
  void *pvVar65;
  undefined1 (*pauVar66) [16];
  void *pvVar67;
  void *pvVar68;
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  float fVar79;
  float fVar80;
  float fVar81;
  undefined1 auVar82 [64];
  undefined1 auVar83 [64];
  float fVar84;
  float fVar85;
  float fVar86;
  float fVar87;
  float fVar88;
  float fVar89;
  float fVar90;
  float fVar91;
  float fVar92;
  float fVar93;
  undefined1 auVar94 [64];
  float local_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float local_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float local_1e8;
  float fStack_1e4;
  float fStack_1e0;
  float fStack_1dc;
  ulong local_1d0;
  float local_1c8;
  float fStack_1c4;
  float fStack_1c0;
  float fStack_1bc;
  float local_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float local_1a8;
  float fStack_1a4;
  float fStack_1a0;
  float fStack_19c;
  float local_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  float local_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  float local_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float local_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  ulong local_f8;
  float local_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  undefined8 *local_90;
  
  uVar20 = bottom_blob->c;
  uVar21 = top_blob->w;
  iVar22 = top_blob->h;
  iVar23 = top_blob->c;
  pvVar24 = _bias->data;
  local_1d0 = (long)iVar23 & 0xfffffffffffffffe;
  if (0 < iVar23 >> 1) {
    lVar61 = 1;
    lVar55 = 0;
    uVar53 = 0;
    do {
      iVar57 = 1;
      if (top_blob->dims != 3) {
        iVar57 = top_blob->d;
      }
      auVar69 = ZEXT816(0) << 0x40;
      auVar70 = ZEXT816(0) << 0x40;
      if (pvVar24 != (void *)0x0) {
        auVar70 = *(undefined1 (*) [16])((long)pvVar24 + uVar53 * 0x20);
      }
      lVar5 = uVar53 * 2 + 1;
      if (pvVar24 != (void *)0x0) {
        auVar69 = *(undefined1 (*) [16])((long)pvVar24 + lVar5 * 0x10);
      }
      sVar25 = top_blob->cstep;
      pvVar26 = top_blob->data;
      sVar27 = top_blob->elemsize;
      uVar54 = iVar57 * top_blob->h * top_blob->w;
      if (0 < (int)uVar54) {
        lVar60 = 0;
        do {
          *(undefined1 (*) [16])((long)pvVar26 + lVar60 + sVar25 * sVar27 * lVar55) = auVar70;
          lVar60 = lVar60 + 0x10;
        } while ((ulong)uVar54 << 4 != lVar60);
      }
      if (0 < (int)uVar54) {
        lVar60 = 0;
        do {
          *(undefined1 (*) [16])((long)pvVar26 + lVar60 + sVar25 * sVar27 * lVar61) = auVar69;
          lVar60 = lVar60 + 0x10;
        } while ((ulong)uVar54 << 4 != lVar60);
      }
      if (0 < (int)uVar20) {
        pauVar66 = (undefined1 (*) [16])
                   (lVar5 * kernel->cstep * kernel->elemsize + (long)kernel->data);
        local_90 = (undefined8 *)
                   (kernel->cstep * uVar53 * 2 * kernel->elemsize + (long)kernel->data);
        local_f8 = 0;
        do {
          if (0 < iVar22) {
            uVar42 = *local_90;
            uVar43 = local_90[1];
            pauVar1 = (undefined1 (*) [12])(local_90 + 2);
            auVar44 = *pauVar1;
            local_118 = (float)*(undefined8 *)*pauVar1;
            fStack_114 = (float)((ulong)*(undefined8 *)*pauVar1 >> 0x20);
            fStack_110 = (float)local_90[3];
            fStack_10c = (float)((ulong)local_90[3] >> 0x20);
            auVar70 = *(undefined1 (*) [16])(local_90 + 4);
            auVar69 = *(undefined1 (*) [16])(local_90 + 6);
            auVar16 = *(undefined1 (*) [16])(local_90 + 8);
            fVar28 = *(float *)*(undefined1 (*) [12])(local_90 + 10);
            fVar29 = *(float *)((long)local_90 + 0x54);
            fVar30 = *(float *)(local_90 + 0xb);
            auVar49 = *(undefined1 (*) [12])(local_90 + 10);
            fVar31 = *(float *)((long)local_90 + 0x5c);
            auVar17 = *(undefined1 (*) [16])(local_90 + 0xc);
            fVar32 = *(float *)(local_90 + 0xe);
            fVar33 = *(float *)((long)local_90 + 0x74);
            fVar34 = *(float *)(local_90 + 0xf);
            fVar35 = *(float *)((long)local_90 + 0x7c);
            auVar18 = *(undefined1 (*) [16])(local_90 + 0x10);
            auVar71 = *pauVar66;
            auVar82 = ZEXT1664(auVar71);
            auVar47 = *(undefined1 (*) [12])pauVar66[1];
            auVar48 = pauVar66[1];
            fVar84 = *(float *)pauVar66[2];
            fVar85 = *(float *)(pauVar66[2] + 4);
            fVar86 = *(float *)(pauVar66[2] + 8);
            fVar87 = *(float *)(pauVar66[2] + 0xc);
            fVar88 = *(float *)pauVar66[3];
            fVar89 = *(float *)(pauVar66[3] + 4);
            fVar90 = *(float *)(pauVar66[3] + 8);
            fVar36 = *(float *)(pauVar66[3] + 0xc);
            fVar37 = *(float *)pauVar66[4];
            fVar38 = *(float *)(pauVar66[4] + 4);
            fVar39 = *(float *)(pauVar66[4] + 8);
            fVar40 = *(float *)(pauVar66[4] + 0xc);
            auVar72 = pauVar66[5];
            auVar73 = pauVar66[6];
            pvVar68 = (void *)(bottom_blob->cstep * local_f8 * bottom_blob->elemsize +
                              (long)bottom_blob->data);
            lVar60 = (long)bottom_blob->w * bottom_blob->elemsize;
            pvVar56 = (void *)((long)pvVar68 + lVar60 * 2);
            pvVar63 = (void *)(lVar60 + (long)pvVar68);
            iVar57 = 0;
            auVar19 = pauVar66[7];
            auVar94 = ZEXT1664(auVar19);
            pauVar2 = pauVar66 + 8;
            auVar46 = *(undefined1 (*) [12])*pauVar2;
            auVar45 = *(undefined1 (*) [12])*pauVar2;
            local_d8 = (float)*(undefined8 *)*pauVar2;
            fStack_d4 = (float)((ulong)*(undefined8 *)*pauVar2 >> 0x20);
            fStack_d0 = (float)*(undefined8 *)(pauVar66[8] + 8);
            fStack_cc = (float)((ulong)*(undefined8 *)(pauVar66[8] + 8) >> 0x20);
            pvVar62 = (void *)(sVar25 * uVar53 * 2 * sVar27 + (long)pvVar26);
            pvVar52 = (void *)(sVar25 * lVar5 * sVar27 + (long)pvVar26);
            do {
              local_218 = (float)uVar42;
              fStack_210 = (float)uVar43;
              local_1e8 = auVar70._0_4_;
              fStack_1e0 = auVar70._8_4_;
              fStack_1dc = auVar70._12_4_;
              local_1a8 = auVar69._0_4_;
              fStack_1a4 = auVar69._4_4_;
              fStack_1a0 = auVar69._8_4_;
              fStack_19c = auVar69._12_4_;
              local_1b8 = auVar16._0_4_;
              fStack_1b0 = auVar16._8_4_;
              fStack_1ac = auVar16._12_4_;
              local_1f8 = auVar48._0_4_;
              fVar41 = local_1f8;
              fStack_1f0 = auVar48._8_4_;
              fStack_1ec = auVar48._12_4_;
              local_108 = auVar71._0_4_;
              fStack_104 = auVar71._4_4_;
              fStack_100 = auVar71._8_4_;
              fStack_fc = auVar71._12_4_;
              local_1c8 = auVar17._0_4_;
              fStack_1c4 = auVar17._4_4_;
              fStack_1c0 = auVar17._8_4_;
              fStack_1bc = auVar17._12_4_;
              fStack_164 = auVar72._4_4_;
              fStack_160 = auVar72._8_4_;
              fStack_15c = auVar72._12_4_;
              fStack_144 = auVar18._4_4_;
              fStack_140 = auVar18._8_4_;
              fStack_13c = auVar18._12_4_;
              local_128 = auVar73._0_4_;
              fStack_124 = auVar73._4_4_;
              fStack_120 = auVar73._8_4_;
              fStack_11c = auVar73._12_4_;
              fStack_214 = (float)((ulong)uVar42 >> 0x20);
              fStack_20c = (float)((ulong)uVar43 >> 0x20);
              fStack_1e4 = auVar70._4_4_;
              fStack_1b4 = auVar16._4_4_;
              fStack_1f4 = auVar47._4_4_;
              fStack_e4 = auVar19._4_4_;
              fStack_e0 = auVar19._8_4_;
              fStack_dc = auVar19._12_4_;
              local_168 = auVar72._0_4_;
              local_148 = auVar18._0_4_;
              local_e8 = auVar19._0_4_;
              if ((int)uVar21 < 4) {
                uVar54 = 0;
              }
              else {
                iVar58 = 3;
                lVar60 = 0;
                pvVar65 = pvVar62;
                pvVar6 = pvVar52;
                do {
                  pvVar67 = pvVar6;
                  pvVar64 = pvVar65;
                  fVar7 = *(float *)((long)pvVar68 + lVar60);
                  fVar8 = *(float *)((long)pvVar68 + lVar60 + 4);
                  fVar9 = *(float *)((long)pvVar68 + lVar60 + 8);
                  fVar91 = *(float *)((long)pvVar63 + lVar60);
                  fVar92 = *(float *)((long)pvVar63 + lVar60 + 4);
                  fVar93 = *(float *)((long)pvVar63 + lVar60 + 8);
                  fVar10 = *(float *)((long)pvVar56 + lVar60);
                  pvVar65 = (void *)((long)pvVar62 + lVar60 * 4 + 0x40);
                  fVar11 = *(float *)((long)pvVar56 + lVar60 + 4);
                  local_1f8 = auVar47._0_4_;
                  fVar12 = *(float *)((long)pvVar56 + lVar60 + 8);
                  pvVar6 = (void *)((long)pvVar52 + lVar60 * 4 + 0x40);
                  fVar13 = *(float *)((long)pvVar6 + -0x40);
                  fVar14 = *(float *)((long)pvVar6 + -0x3c);
                  fVar79 = *(float *)((long)pvVar6 + -0x38);
                  fVar80 = *(float *)((long)pvVar6 + -0x34);
                  *(float *)((long)pvVar65 + -0x40) =
                       fVar8 * local_118 + fVar9 * local_1e8 + fVar91 * local_1a8 + fVar93 * fVar28
                       + fVar11 * fVar32 +
                       fVar92 * local_1b8 + fVar7 * local_218 + *(float *)((long)pvVar65 + -0x40) +
                       fVar10 * local_1c8 + fVar12 * local_148;
                  *(float *)((long)pvVar65 + -0x3c) =
                       fVar8 * fStack_114 + fVar9 * fStack_1e4 + fVar91 * fStack_1a4 +
                       fVar93 * fVar29 + fVar11 * fVar33 +
                       fVar92 * fStack_1b4 + fVar7 * fStack_214 + *(float *)((long)pvVar65 + -0x3c)
                       + fVar10 * fStack_1c4 + fVar12 * fStack_144;
                  *(float *)((long)pvVar65 + -0x38) =
                       fVar8 * fStack_110 + fVar9 * fStack_1e0 + fVar91 * fStack_1a0 +
                       fVar93 * fVar30 + fVar11 * fVar34 +
                       fVar92 * fStack_1b0 + fVar7 * fStack_210 + *(float *)((long)pvVar65 + -0x38)
                       + fVar10 * fStack_1c0 + fVar12 * fStack_140;
                  *(float *)((long)pvVar65 + -0x34) =
                       fVar8 * fStack_10c + fVar9 * fStack_1dc + fVar91 * fStack_19c +
                       fVar93 * fVar31 + fVar11 * fVar35 +
                       fVar92 * fStack_1ac + fVar7 * fStack_20c + *(float *)((long)pvVar65 + -0x34)
                       + fVar10 * fStack_1bc + fVar12 * fStack_13c;
                  *(float *)((long)pvVar6 + -0x40) =
                       fVar9 * fVar84 + fVar8 * local_1f8 + fVar91 * fVar88 + fVar93 * local_168 +
                       fVar11 * local_e8 +
                       fVar12 * local_d8 +
                       fVar92 * fVar37 + fVar7 * local_108 + fVar13 + fVar10 * local_128;
                  *(float *)((long)pvVar6 + -0x3c) =
                       fVar9 * fVar85 + fVar8 * fStack_1f4 + fVar91 * fVar89 + fVar93 * fStack_164 +
                       fVar11 * fStack_e4 +
                       fVar12 * fStack_d4 +
                       fVar92 * fVar38 + fVar7 * fStack_104 + fVar14 + fVar10 * fStack_124;
                  *(float *)((long)pvVar6 + -0x38) =
                       fVar9 * fVar86 + fVar8 * fStack_1f0 + fVar91 * fVar90 + fVar93 * fStack_160 +
                       fVar11 * fStack_e0 +
                       fVar12 * fStack_d0 +
                       fVar92 * fVar39 + fVar7 * fStack_100 + fVar79 + fVar10 * fStack_120;
                  *(float *)((long)pvVar6 + -0x34) =
                       fVar9 * fVar87 + fVar8 * fStack_1ec + fVar91 * fVar36 + fVar93 * fStack_15c +
                       fVar11 * fStack_dc +
                       fVar12 * fStack_cc +
                       fVar92 * fVar40 + fVar7 * fStack_fc + fVar80 + fVar10 * fStack_11c;
                  fVar7 = *(float *)((long)pvVar68 + lVar60 + 0xc);
                  fVar91 = *(float *)((long)pvVar63 + lVar60 + 0xc);
                  fVar10 = *(float *)((long)pvVar56 + lVar60 + 0xc);
                  fVar13 = *(float *)((long)pvVar6 + -0x30);
                  fVar14 = *(float *)((long)pvVar6 + -0x2c);
                  fVar79 = *(float *)((long)pvVar6 + -0x28);
                  fVar80 = *(float *)((long)pvVar6 + -0x24);
                  *(float *)((long)pvVar65 + -0x30) =
                       fVar9 * local_118 + fVar8 * local_218 +
                       fVar93 * local_1b8 + fVar92 * local_1a8 + fVar11 * local_1c8 +
                       *(float *)((long)pvVar65 + -0x30) +
                       fVar7 * local_1e8 + fVar12 * fVar32 + fVar91 * fVar28 + fVar10 * local_148;
                  *(float *)((long)pvVar65 + -0x2c) =
                       fVar9 * fStack_114 + fVar8 * fStack_214 +
                       fVar93 * fStack_1b4 + fVar92 * fStack_1a4 + fVar11 * fStack_1c4 +
                       *(float *)((long)pvVar65 + -0x2c) +
                       fVar7 * fStack_1e4 + fVar12 * fVar33 + fVar91 * fVar29 + fVar10 * fStack_144;
                  *(float *)((long)pvVar65 + -0x28) =
                       fVar9 * fStack_110 + fVar8 * fStack_210 +
                       fVar93 * fStack_1b0 + fVar92 * fStack_1a0 + fVar11 * fStack_1c0 +
                       *(float *)((long)pvVar65 + -0x28) +
                       fVar7 * fStack_1e0 + fVar12 * fVar34 + fVar91 * fVar30 + fVar10 * fStack_140;
                  *(float *)((long)pvVar65 + -0x24) =
                       fVar9 * fStack_10c + fVar8 * fStack_20c +
                       fVar93 * fStack_1ac + fVar92 * fStack_19c + fVar11 * fStack_1bc +
                       *(float *)((long)pvVar65 + -0x24) +
                       fVar7 * fStack_1dc + fVar12 * fVar35 + fVar91 * fVar31 + fVar10 * fStack_13c;
                  *(float *)((long)pvVar6 + -0x30) =
                       fVar9 * local_1f8 + fVar8 * local_108 + fVar92 * fVar88 + fVar93 * fVar37 +
                       fVar11 * local_128 + fVar12 * local_e8 + fVar13 +
                       fVar7 * fVar84 + fVar91 * local_168 + fVar10 * local_d8;
                  *(float *)((long)pvVar6 + -0x2c) =
                       fVar9 * fStack_1f4 + fVar8 * fStack_104 + fVar92 * fVar89 + fVar93 * fVar38 +
                       fVar11 * fStack_124 + fVar12 * fStack_e4 + fVar14 +
                       fVar7 * fVar85 + fVar91 * fStack_164 + fVar10 * fStack_d4;
                  *(float *)((long)pvVar6 + -0x28) =
                       fVar9 * fStack_1f0 + fVar8 * fStack_100 + fVar92 * fVar90 + fVar93 * fVar39 +
                       fVar11 * fStack_120 + fVar12 * fStack_e0 + fVar79 +
                       fVar7 * fVar86 + fVar91 * fStack_160 + fVar10 * fStack_d0;
                  *(float *)((long)pvVar6 + -0x24) =
                       fVar9 * fStack_1ec + fVar8 * fStack_fc + fVar92 * fVar36 + fVar93 * fVar40 +
                       fVar11 * fStack_11c + fVar12 * fStack_dc + fVar80 +
                       fVar7 * fVar87 + fVar91 * fStack_15c + fVar10 * fStack_cc;
                  fVar8 = *(float *)((long)pvVar68 + lVar60 + 0x10);
                  fVar92 = *(float *)((long)pvVar63 + lVar60 + 0x10);
                  fVar11 = *(float *)((long)pvVar56 + lVar60 + 0x10);
                  fVar13 = *(float *)((long)pvVar6 + -0x20);
                  fVar14 = *(float *)((long)pvVar6 + -0x1c);
                  fVar79 = *(float *)((long)pvVar6 + -0x18);
                  fVar80 = *(float *)((long)pvVar6 + -0x14);
                  *(float *)((long)pvVar65 + -0x20) =
                       fVar93 * local_1a8 + fVar9 * local_218 +
                       fVar12 * local_1c8 + fVar7 * local_118 + fVar91 * local_1b8 +
                       *(float *)((long)pvVar65 + -0x20) +
                       fVar10 * fVar32 + fVar8 * local_1e8 + fVar92 * auVar49._0_4_ +
                       local_148 * fVar11;
                  *(float *)((long)pvVar65 + -0x1c) =
                       fVar93 * fStack_1a4 + fVar9 * fStack_214 +
                       fVar12 * fStack_1c4 + fVar7 * fStack_114 + fVar91 * fStack_1b4 +
                       *(float *)((long)pvVar65 + -0x1c) +
                       fVar10 * fVar33 + fVar8 * fStack_1e4 + fVar92 * auVar49._4_4_ +
                       fStack_144 * fVar11;
                  *(float *)((long)pvVar65 + -0x18) =
                       fVar93 * fStack_1a0 + fVar9 * fStack_210 +
                       fVar12 * fStack_1c0 + fVar7 * fStack_110 + fVar91 * fStack_1b0 +
                       *(float *)((long)pvVar65 + -0x18) +
                       fVar10 * fVar34 + fVar8 * fStack_1e0 + fVar92 * auVar49._8_4_ +
                       fStack_140 * fVar11;
                  *(float *)((long)pvVar65 + -0x14) =
                       fVar93 * fStack_19c + fVar9 * fStack_20c +
                       fVar12 * fStack_1bc + fVar7 * fStack_10c + fVar91 * fStack_1ac +
                       *(float *)((long)pvVar65 + -0x14) +
                       fVar10 * fVar35 + fVar8 * fStack_1dc + fVar92 * fVar31 + fStack_13c * fVar11;
                  *(float *)((long)pvVar6 + -0x20) =
                       fVar8 * fVar84 + fVar92 * local_168 + local_d8 * fVar11 +
                       fVar91 * fVar37 + local_e8 * fVar10 +
                       fVar9 * local_108 + fVar93 * fVar88 + fVar7 * fVar41 + fVar12 * local_128 +
                       fVar13;
                  *(float *)((long)pvVar6 + -0x1c) =
                       fVar8 * fVar85 + fVar92 * fStack_164 + fStack_d4 * fVar11 +
                       fVar91 * fVar38 + fStack_e4 * fVar10 +
                       fVar9 * fStack_104 + fVar93 * fVar89 +
                       fVar7 * fStack_1f4 + fVar12 * fStack_124 + fVar14;
                  *(float *)((long)pvVar6 + -0x18) =
                       fVar8 * fVar86 + fVar92 * fStack_160 + fStack_d0 * fVar11 +
                       fVar91 * fVar39 + fStack_e0 * fVar10 +
                       fVar9 * fStack_100 + fVar93 * fVar90 +
                       fVar7 * fStack_1f0 + fVar12 * fStack_120 + fVar79;
                  *(float *)((long)pvVar6 + -0x14) =
                       fVar8 * fVar87 + fVar92 * fStack_15c + fStack_cc * fVar11 +
                       fVar91 * fVar40 + fStack_dc * fVar10 +
                       fVar9 * fStack_fc + fVar93 * fVar36 +
                       fVar7 * fStack_1ec + fVar12 * fStack_11c + fVar80;
                  fVar9 = *(float *)((long)pvVar68 + lVar60 + 0x14);
                  fVar93 = *(float *)((long)pvVar63 + lVar60 + 0x14);
                  fVar12 = *(float *)((long)pvVar56 + lVar60 + 0x14);
                  auVar77._0_4_ =
                       fVar92 * local_1b8 + fVar11 * fVar32 +
                       fVar10 * local_1c8 + fVar8 * local_118 +
                       fVar91 * local_1a8 + fVar7 * local_218 + *(float *)((long)pvVar65 + -0x10) +
                       fVar93 * auVar49._0_4_ + fVar9 * local_1e8 + fVar12 * local_148;
                  auVar77._4_4_ =
                       fVar92 * fStack_1b4 + fVar11 * fVar33 +
                       fVar10 * fStack_1c4 + fVar8 * fStack_114 +
                       fVar91 * fStack_1a4 + fVar7 * fStack_214 + *(float *)((long)pvVar65 + -0xc) +
                       fVar93 * auVar49._4_4_ + fVar9 * fStack_1e4 + fVar12 * fStack_144;
                  auVar77._8_4_ =
                       fVar92 * fStack_1b0 + fVar11 * fVar34 +
                       fVar10 * fStack_1c0 + fVar8 * fStack_110 +
                       fVar91 * fStack_1a0 + fVar7 * fStack_210 + *(float *)((long)pvVar65 + -8) +
                       fVar93 * auVar49._8_4_ + fVar9 * fStack_1e0 + fVar12 * fStack_140;
                  auVar77._12_4_ =
                       fVar92 * fStack_1ac + fVar11 * fVar35 +
                       fVar10 * fStack_1bc + fVar8 * fStack_10c +
                       fVar91 * fStack_19c + fVar7 * fStack_20c + *(float *)((long)pvVar65 + -4) +
                       fVar93 * fVar31 + fVar9 * fStack_1dc + fVar12 * fStack_13c;
                  auVar74._0_4_ =
                       fVar91 * fVar88 + fVar7 * local_108 + fVar8 * fVar41 + fVar10 * local_128 +
                       fVar92 * fVar37 + fVar11 * local_e8 + fVar9 * fVar84 +
                       *(float *)((long)pvVar6 + -0x10) + fVar93 * local_168 + fVar12 * local_d8;
                  auVar74._4_4_ =
                       fVar91 * fVar89 + fVar7 * fStack_104 +
                       fVar8 * fStack_1f4 + fVar10 * fStack_124 +
                       fVar92 * fVar38 + fVar11 * fStack_e4 + fVar9 * fVar85 +
                       *(float *)((long)pvVar6 + -0xc) + fVar93 * fStack_164 + fVar12 * fStack_d4;
                  auVar74._8_4_ =
                       fVar91 * fVar90 + fVar7 * fStack_100 +
                       fVar8 * fStack_1f0 + fVar10 * fStack_120 +
                       fVar92 * fVar39 + fVar11 * fStack_e0 + fVar9 * fVar86 +
                       *(float *)((long)pvVar6 + -8) + fVar93 * fStack_160 + fVar12 * fStack_d0;
                  auVar74._12_4_ =
                       fVar91 * fVar36 + fVar7 * fStack_fc +
                       fVar8 * fStack_1ec + fVar10 * fStack_11c +
                       fVar92 * fVar40 + fVar11 * fStack_dc + fVar9 * fVar87 +
                       *(float *)((long)pvVar6 + -4) + fVar93 * fStack_15c + fVar12 * fStack_cc;
                  *(undefined1 (*) [16])((long)pvVar65 + -0x10) = auVar77;
                  *(undefined1 (*) [16])((long)pvVar6 + -0x10) = auVar74;
                  lVar60 = lVar60 + 0x10;
                  iVar58 = iVar58 + 4;
                } while (iVar58 < (int)uVar21);
                pvVar62 = (void *)((long)pvVar64 + 0x40);
                pvVar52 = (void *)((long)pvVar67 + 0x40);
                pvVar68 = (void *)((long)pvVar68 + lVar60);
                pvVar63 = (void *)((long)pvVar63 + lVar60);
                pvVar56 = (void *)((long)pvVar56 + lVar60);
                auVar82 = ZEXT1664(auVar71);
                auVar94 = ZEXT1664(auVar19);
                uVar54 = uVar21 & 0xfffffffc;
              }
              if ((int)(uVar54 | 1) < (int)uVar21) {
                lVar60 = 0;
                pvVar6 = pvVar52;
                pvVar65 = pvVar62;
                uVar51 = uVar54;
                do {
                  pvVar67 = pvVar65;
                  pvVar64 = pvVar6;
                  fVar7 = *(float *)((long)pvVar68 + lVar60);
                  fVar8 = *(float *)((long)pvVar68 + lVar60 + 4);
                  fVar9 = *(float *)((long)pvVar68 + lVar60 + 8);
                  fVar91 = *(float *)((long)pvVar63 + lVar60);
                  fVar92 = *(float *)((long)pvVar63 + lVar60 + 4);
                  fVar93 = *(float *)((long)pvVar63 + lVar60 + 8);
                  fVar10 = *(float *)((long)pvVar56 + lVar60);
                  pvVar65 = (void *)((long)pvVar62 + lVar60 * 4 + 0x20);
                  fVar11 = *(float *)((long)pvVar56 + lVar60 + 4);
                  pvVar6 = (void *)((long)pvVar52 + lVar60 * 4 + 0x20);
                  fVar13 = *(float *)((long)pvVar6 + -0x20);
                  fVar14 = *(float *)((long)pvVar6 + -0x1c);
                  fVar79 = *(float *)((long)pvVar6 + -0x18);
                  fVar80 = *(float *)((long)pvVar6 + -0x14);
                  fVar12 = *(float *)((long)pvVar56 + lVar60 + 8);
                  *(float *)((long)pvVar65 + -0x20) =
                       fVar7 * local_218 + *(float *)((long)pvVar65 + -0x20) + local_1b8 * fVar92 +
                       fVar10 * local_1c8 + fVar12 * local_148 +
                       auVar44._0_4_ * fVar8 + fVar9 * local_1e8 + fVar91 * local_1a8 +
                       fVar93 * fVar28 + fVar11 * fVar32;
                  *(float *)((long)pvVar65 + -0x1c) =
                       fVar7 * fStack_214 + *(float *)((long)pvVar65 + -0x1c) + fStack_1b4 * fVar92
                       + fVar10 * fStack_1c4 + fVar12 * fStack_144 +
                       auVar44._4_4_ * fVar8 + fVar9 * fStack_1e4 + fVar91 * fStack_1a4 +
                       fVar93 * fVar29 + fVar11 * fVar33;
                  *(float *)((long)pvVar65 + -0x18) =
                       fVar7 * fStack_210 + *(float *)((long)pvVar65 + -0x18) + fStack_1b0 * fVar92
                       + fVar10 * fStack_1c0 + fVar12 * fStack_140 +
                       auVar44._8_4_ * fVar8 + fVar9 * fStack_1e0 + fVar91 * fStack_1a0 +
                       fVar93 * fVar30 + fVar11 * fVar34;
                  *(float *)((long)pvVar65 + -0x14) =
                       fVar7 * fStack_20c + *(float *)((long)pvVar65 + -0x14) + fStack_1ac * fVar92
                       + fVar10 * fStack_1bc + fVar12 * fStack_13c +
                       fStack_10c * fVar8 + fVar9 * fStack_1dc + fVar91 * fStack_19c +
                       fVar93 * fVar31 + fVar11 * fVar35;
                  *(float *)((long)pvVar6 + -0x20) =
                       fVar7 * local_108 + fVar13 + fVar37 * fVar92 + fVar10 * local_128 +
                       fVar12 * auVar45._0_4_ +
                       fVar93 * local_168 + fVar8 * fVar41 + fVar9 * fVar84 + fVar91 * fVar88 +
                       fVar11 * local_e8;
                  *(float *)((long)pvVar6 + -0x1c) =
                       fVar7 * fStack_104 + fVar14 + fVar38 * fVar92 + fVar10 * fStack_124 +
                       fVar12 * auVar45._4_4_ +
                       fVar93 * fStack_164 + fVar8 * fStack_1f4 + fVar9 * fVar85 + fVar91 * fVar89 +
                       fVar11 * fStack_e4;
                  *(float *)((long)pvVar6 + -0x18) =
                       fVar7 * fStack_100 + fVar79 + fVar39 * fVar92 + fVar10 * fStack_120 +
                       fVar12 * auVar45._8_4_ +
                       fVar93 * fStack_160 + fVar8 * fStack_1f0 + fVar9 * fVar86 + fVar91 * fVar90 +
                       fVar11 * fStack_e0;
                  *(float *)((long)pvVar6 + -0x14) =
                       fVar7 * fStack_fc + fVar80 + fVar40 * fVar92 + fVar10 * fStack_11c +
                       fVar12 * fStack_cc +
                       fVar93 * fStack_15c + fVar8 * fStack_1ec + fVar9 * fVar87 + fVar91 * fVar36 +
                       fVar11 * fStack_dc;
                  fVar7 = *(float *)((long)pvVar68 + lVar60 + 0xc);
                  fVar91 = *(float *)((long)pvVar63 + lVar60 + 0xc);
                  fVar10 = *(float *)((long)pvVar56 + lVar60 + 0xc);
                  auVar78._0_4_ =
                       auVar44._0_4_ * fVar9 + fVar8 * local_218 +
                       fVar92 * local_1a8 + local_1b8 * fVar93 + fVar11 * local_1c8 +
                       *(float *)((long)pvVar65 + -0x10) +
                       fVar12 * fVar32 + fVar7 * local_1e8 + fVar91 * fVar28 + fVar10 * local_148;
                  auVar78._4_4_ =
                       auVar44._4_4_ * fVar9 + fVar8 * fStack_214 +
                       fVar92 * fStack_1a4 + fStack_1b4 * fVar93 + fVar11 * fStack_1c4 +
                       *(float *)((long)pvVar65 + -0xc) +
                       fVar12 * fVar33 + fVar7 * fStack_1e4 + fVar91 * fVar29 + fVar10 * fStack_144;
                  auVar78._8_4_ =
                       auVar44._8_4_ * fVar9 + fVar8 * fStack_210 +
                       fVar92 * fStack_1a0 + fStack_1b0 * fVar93 + fVar11 * fStack_1c0 +
                       *(float *)((long)pvVar65 + -8) +
                       fVar12 * fVar34 + fVar7 * fStack_1e0 + fVar91 * fVar30 + fVar10 * fStack_140;
                  auVar78._12_4_ =
                       fStack_10c * fVar9 + fVar8 * fStack_20c +
                       fVar92 * fStack_19c + fStack_1ac * fVar93 + fVar11 * fStack_1bc +
                       *(float *)((long)pvVar65 + -4) +
                       fVar12 * fVar35 + fVar7 * fStack_1dc + fVar91 * fVar31 + fVar10 * fStack_13c;
                  auVar75._0_4_ =
                       fVar9 * fVar41 + fVar8 * local_108 + fVar92 * fVar88 + fVar37 * fVar93 +
                       fVar11 * local_128 + fVar12 * local_e8 + *(float *)((long)pvVar6 + -0x10) +
                       fVar7 * fVar84 + fVar91 * local_168 + fVar10 * auVar45._0_4_;
                  auVar75._4_4_ =
                       fVar9 * fStack_1f4 + fVar8 * fStack_104 + fVar92 * fVar89 + fVar38 * fVar93 +
                       fVar11 * fStack_124 + fVar12 * fStack_e4 + *(float *)((long)pvVar6 + -0xc) +
                       fVar7 * fVar85 + fVar91 * fStack_164 + fVar10 * auVar45._4_4_;
                  auVar75._8_4_ =
                       fVar9 * fStack_1f0 + fVar8 * fStack_100 + fVar92 * fVar90 + fVar39 * fVar93 +
                       fVar11 * fStack_120 + fVar12 * fStack_e0 + *(float *)((long)pvVar6 + -8) +
                       fVar7 * fVar86 + fVar91 * fStack_160 + fVar10 * auVar45._8_4_;
                  auVar75._12_4_ =
                       fVar9 * fStack_1ec + fVar8 * fStack_fc + fVar92 * fVar36 + fVar40 * fVar93 +
                       fVar11 * fStack_11c + fVar12 * fStack_dc + *(float *)((long)pvVar6 + -4) +
                       fVar7 * fVar87 + fVar91 * fStack_15c + fVar10 * fStack_cc;
                  *(undefined1 (*) [16])((long)pvVar65 + -0x10) = auVar78;
                  *(undefined1 (*) [16])((long)pvVar6 + -0x10) = auVar75;
                  uVar54 = uVar51 + 2;
                  lVar60 = lVar60 + 8;
                  iVar58 = uVar51 + 3;
                  uVar51 = uVar54;
                } while (iVar58 < (int)uVar21);
                pvVar62 = (void *)((long)pvVar67 + 0x20);
                pvVar52 = (void *)((long)pvVar64 + 0x20);
                pvVar68 = (void *)((long)pvVar68 + lVar60);
                pvVar63 = (void *)((long)pvVar63 + lVar60);
                pvVar56 = (void *)((long)pvVar56 + lVar60);
                auVar82 = ZEXT1664(auVar71);
                auVar94 = ZEXT1664(auVar19);
              }
              auVar50 = *pauVar1;
              iVar58 = uVar21 - uVar54;
              if (iVar58 != 0 && (int)uVar54 <= (int)uVar21) {
                lVar60 = 0;
                lVar59 = 0;
                auVar83 = auVar82;
                do {
                  fVar7 = *(float *)((long)pvVar68 + lVar60);
                  fVar8 = *(float *)((long)pvVar68 + lVar60 + 4);
                  fVar9 = *(float *)((long)pvVar68 + lVar60 + 8);
                  fVar91 = *(float *)((long)pvVar63 + lVar60);
                  fVar92 = *(float *)((long)pvVar63 + lVar60 + 4);
                  fVar93 = *(float *)((long)pvVar63 + lVar60 + 8);
                  fVar10 = *(float *)((long)pvVar56 + lVar60);
                  fVar11 = *(float *)((long)pvVar56 + lVar60 + 4);
                  fVar12 = *(float *)((long)pvVar56 + lVar60 + 8);
                  pfVar3 = (float *)((long)pvVar62 + lVar60 * 4);
                  fVar13 = pfVar3[1];
                  fVar14 = pfVar3[2];
                  fVar79 = pfVar3[3];
                  auVar82 = ZEXT1664(auVar83._0_16_);
                  pfVar4 = (float *)((long)pvVar52 + lVar60 * 4);
                  auVar76._0_4_ =
                       fVar92 * fVar37 + fVar7 * auVar83._0_4_ + *pfVar4 + fVar10 * local_128 +
                       fVar12 * auVar46._0_4_ +
                       fVar91 * fVar88 + fVar9 * fVar84 + fVar8 * fVar41 + fVar93 * local_168 +
                       auVar94._0_4_ * fVar11;
                  auVar76._4_4_ =
                       fVar92 * fVar38 + fVar7 * auVar83._4_4_ + pfVar4[1] + fVar10 * fStack_124 +
                       fVar12 * auVar46._4_4_ +
                       fVar91 * fVar89 + fVar9 * fVar85 + fVar8 * fStack_1f4 + fVar93 * fStack_164 +
                       auVar94._4_4_ * fVar11;
                  auVar76._8_4_ =
                       fVar92 * fVar39 + fVar7 * auVar83._8_4_ + pfVar4[2] + fVar10 * fStack_120 +
                       fVar12 * auVar46._8_4_ +
                       fVar91 * fVar90 + fVar9 * fVar86 + fVar8 * fStack_1f0 + fVar93 * fStack_160 +
                       auVar94._8_4_ * fVar11;
                  auVar76._12_4_ =
                       fVar92 * fVar40 + fVar7 * auVar83._12_4_ + pfVar4[3] + fVar10 * fStack_11c +
                       fVar12 * fStack_cc +
                       fVar91 * fVar36 + fVar9 * fVar87 + fVar8 * fStack_1ec + fVar93 * fStack_15c +
                       auVar94._12_4_ * fVar11;
                  pfVar4 = (float *)((long)pvVar62 + lVar60 * 4);
                  *pfVar4 = fVar7 * local_218 + *pfVar3 + fVar92 * local_1b8 + fVar10 * local_1c8 +
                            fVar12 * local_148 +
                            auVar50._0_4_ * fVar8 + fVar9 * local_1e8 + fVar91 * local_1a8 +
                            fVar93 * fVar28 + fVar11 * fVar32;
                  pfVar4[1] = fVar7 * fStack_214 + fVar13 + fVar92 * fStack_1b4 +
                              fVar10 * fStack_1c4 + fVar12 * fStack_144 +
                              auVar50._4_4_ * fVar8 + fVar9 * fStack_1e4 + fVar91 * fStack_1a4 +
                              fVar93 * fVar29 + fVar11 * fVar33;
                  pfVar4[2] = fVar7 * fStack_210 + fVar14 + fVar92 * fStack_1b0 +
                              fVar10 * fStack_1c0 + fVar12 * fStack_140 +
                              auVar50._8_4_ * fVar8 + fVar9 * fStack_1e0 + fVar91 * fStack_1a0 +
                              fVar93 * fVar30 + fVar11 * fVar34;
                  pfVar4[3] = fVar7 * fStack_20c + fVar79 + fVar92 * fStack_1ac +
                              fVar10 * fStack_1bc + fVar12 * fStack_13c +
                              fStack_10c * fVar8 + fVar9 * fStack_1dc + fVar91 * fStack_19c +
                              fVar93 * fVar31 + fVar11 * fVar35;
                  *(undefined1 (*) [16])((long)pvVar52 + lVar60 * 4) = auVar76;
                  lVar59 = lVar59 + -0x10;
                  lVar60 = lVar60 + 4;
                  iVar58 = iVar58 + -1;
                  auVar83 = auVar82;
                } while (iVar58 != 0);
                pvVar62 = (void *)((long)pvVar62 - lVar59);
                pvVar52 = (void *)((long)pvVar52 - lVar59);
                pvVar68 = (void *)((long)pvVar68 + lVar60);
                pvVar63 = (void *)((long)pvVar63 + lVar60);
                pvVar56 = (void *)((long)pvVar56 + lVar60);
                auVar94 = ZEXT1664(auVar94._0_16_);
              }
              pvVar68 = (void *)((long)pvVar68 + 8);
              pvVar63 = (void *)((long)pvVar63 + 8);
              pvVar56 = (void *)((long)pvVar56 + 8);
              iVar57 = iVar57 + 1;
            } while (iVar57 != iVar22);
          }
          pauVar66 = pauVar66 + 9;
          local_90 = local_90 + 0x12;
          local_f8 = local_f8 + 1;
        } while (local_f8 != uVar20);
      }
      uVar53 = uVar53 + 1;
      lVar55 = lVar55 + 2;
      lVar61 = lVar61 + 2;
    } while (uVar53 != (uint)(iVar23 >> 1));
  }
  if ((int)local_1d0 != iVar23) {
    do {
      iVar57 = 1;
      if (top_blob->dims != 3) {
        iVar57 = top_blob->d;
      }
      if (pvVar24 == (void *)0x0) {
        auVar70 = ZEXT816(0) << 0x40;
      }
      else {
        auVar70 = *(undefined1 (*) [16])((long)pvVar24 + local_1d0 * 0x10);
      }
      sVar25 = top_blob->cstep;
      pvVar26 = top_blob->data;
      sVar27 = top_blob->elemsize;
      uVar54 = iVar57 * top_blob->h * top_blob->w;
      if (0 < (int)uVar54) {
        lVar55 = 0;
        do {
          *(undefined1 (*) [16])((long)pvVar26 + lVar55 + sVar25 * sVar27 * local_1d0) = auVar70;
          lVar55 = lVar55 + 0x10;
        } while ((ulong)uVar54 << 4 != lVar55);
      }
      if (0 < (int)uVar20) {
        pauVar66 = (undefined1 (*) [16])
                   (kernel->cstep * local_1d0 * kernel->elemsize + (long)kernel->data);
        uVar53 = 0;
        do {
          if (0 < iVar22) {
            auVar70 = *pauVar66;
            pauVar2 = pauVar66 + 1;
            fVar88 = *(float *)*pauVar2;
            fVar89 = *(float *)(pauVar66[1] + 4);
            fVar90 = *(float *)(pauVar66[1] + 8);
            auVar45 = *(undefined1 (*) [12])*pauVar2;
            fVar36 = *(float *)(pauVar66[1] + 0xc);
            auVar18 = *pauVar2;
            fVar41 = *(float *)pauVar66[2];
            fVar7 = *(float *)(pauVar66[2] + 4);
            uVar42 = *(undefined8 *)pauVar66[2];
            fVar8 = *(float *)(pauVar66[2] + 8);
            fVar9 = *(float *)(pauVar66[2] + 0xc);
            uVar43 = *(undefined8 *)(pauVar66[2] + 8);
            fVar32 = *(float *)pauVar66[3];
            fVar33 = *(float *)(pauVar66[3] + 4);
            fVar34 = *(float *)(pauVar66[3] + 8);
            auVar47 = *(undefined1 (*) [12])pauVar66[3];
            fVar35 = *(float *)(pauVar66[3] + 0xc);
            auVar69 = pauVar66[4];
            auVar16 = pauVar66[5];
            pauVar2 = pauVar66 + 6;
            fVar37 = *(float *)*pauVar2;
            fVar38 = *(float *)(pauVar66[6] + 4);
            fVar39 = *(float *)(pauVar66[6] + 8);
            auVar49 = *(undefined1 (*) [12])*pauVar2;
            auVar46 = *(undefined1 (*) [12])*pauVar2;
            fVar40 = *(float *)(pauVar66[6] + 0xc);
            pauVar2 = pauVar66 + 7;
            fVar84 = *(float *)*pauVar2;
            fVar85 = *(float *)(pauVar66[7] + 4);
            fVar86 = *(float *)(pauVar66[7] + 8);
            auVar44 = *(undefined1 (*) [12])*pauVar2;
            fVar87 = *(float *)(pauVar66[7] + 0xc);
            auVar17 = *pauVar2;
            fVar28 = *(float *)pauVar66[8];
            fVar29 = *(float *)(pauVar66[8] + 4);
            fVar30 = *(float *)(pauVar66[8] + 8);
            fVar31 = *(float *)(pauVar66[8] + 0xc);
            pvVar63 = (void *)(bottom_blob->cstep * uVar53 * bottom_blob->elemsize +
                              (long)bottom_blob->data);
            lVar55 = (long)bottom_blob->w * bottom_blob->elemsize;
            pvVar56 = (void *)((long)pvVar63 + lVar55 * 2);
            pvVar52 = (void *)(lVar55 + (long)pvVar63);
            iVar57 = 0;
            pvVar62 = (void *)((long)pvVar26 + sVar25 * local_1d0 * sVar27);
            fVar91 = fVar36;
            fVar92 = fVar41;
            fVar93 = fVar8;
            do {
              fStack_1b4 = auVar18._4_4_;
              fStack_1b0 = auVar18._8_4_;
              fStack_1ac = auVar18._12_4_;
              local_218 = (float)uVar42;
              fStack_210 = (float)uVar43;
              fStack_1c4 = auVar70._4_4_;
              fStack_1c0 = auVar70._8_4_;
              fStack_1bc = auVar70._12_4_;
              local_1e8 = auVar16._0_4_;
              fStack_1e4 = auVar16._4_4_;
              fStack_1e0 = auVar16._8_4_;
              fStack_1dc = auVar16._12_4_;
              local_1a8 = auVar17._0_4_;
              fVar12 = local_1a8;
              fStack_1a4 = auVar17._4_4_;
              fStack_1a0 = auVar17._8_4_;
              fStack_19c = auVar17._12_4_;
              fVar10 = auVar45._4_4_;
              fVar11 = auVar45._8_4_;
              local_1c8 = auVar70._0_4_;
              local_1f8 = auVar69._0_4_;
              fStack_1f4 = auVar69._4_4_;
              fStack_1f0 = auVar69._8_4_;
              fStack_1ec = auVar69._12_4_;
              local_1b8 = auVar45._0_4_;
              if ((int)uVar21 < 4) {
                uVar54 = 0;
                pvVar68 = pvVar62;
              }
              else {
                iVar58 = 3;
                lVar55 = 0;
                pvVar68 = pvVar62;
                do {
                  pvVar65 = pvVar68;
                  fVar84 = *(float *)((long)pvVar63 + lVar55);
                  fVar85 = *(float *)((long)pvVar63 + lVar55 + 4);
                  fVar86 = *(float *)((long)pvVar63 + lVar55 + 8);
                  fVar87 = *(float *)((long)pvVar52 + lVar55);
                  fVar88 = *(float *)((long)pvVar52 + lVar55 + 4);
                  fVar89 = *(float *)((long)pvVar52 + lVar55 + 8);
                  fVar90 = *(float *)((long)pvVar56 + lVar55);
                  fVar91 = *(float *)((long)pvVar56 + lVar55 + 4);
                  fVar92 = *(float *)((long)pvVar56 + lVar55 + 8);
                  pvVar68 = (void *)((long)pvVar62 + lVar55 * 4 + 0x40);
                  fVar79 = auVar46._0_4_;
                  fVar80 = auVar46._4_4_;
                  fVar81 = auVar46._8_4_;
                  local_1a8 = auVar44._0_4_;
                  fVar93 = *(float *)((long)pvVar63 + lVar55 + 0xc);
                  fVar13 = *(float *)((long)pvVar52 + lVar55 + 0xc);
                  fVar14 = *(float *)((long)pvVar56 + lVar55 + 0xc);
                  *(float *)((long)pvVar68 + -0x40) =
                       fVar84 * local_1c8 + *(float *)((long)pvVar68 + -0x40) + fVar88 * local_1f8 +
                       fVar79 * fVar90 + fVar92 * fVar28 +
                       fVar91 * local_1a8 +
                       fVar89 * local_1e8 + fVar87 * fVar32 + fVar85 * local_1b8 + fVar86 * fVar41;
                  *(float *)((long)pvVar68 + -0x3c) =
                       fVar84 * fStack_1c4 + *(float *)((long)pvVar68 + -0x3c) + fVar88 * fStack_1f4
                       + fVar80 * fVar90 + fVar92 * fVar29 +
                       fVar91 * fStack_1a4 +
                       fVar89 * fStack_1e4 + fVar87 * fVar33 + fVar85 * fStack_1b4 + fVar86 * fVar7;
                  *(float *)((long)pvVar68 + -0x38) =
                       fVar84 * fStack_1c0 + *(float *)((long)pvVar68 + -0x38) + fVar88 * fStack_1f0
                       + fVar81 * fVar90 + fVar92 * fVar30 +
                       fVar91 * fStack_1a0 +
                       fVar89 * fStack_1e0 + fVar87 * fVar34 + fVar85 * fStack_1b0 + fVar86 * fVar8;
                  *(float *)((long)pvVar68 + -0x34) =
                       fVar84 * fStack_1bc + *(float *)((long)pvVar68 + -0x34) + fVar88 * fStack_1ec
                       + fVar40 * fVar90 + fVar92 * fVar31 +
                       fVar91 * fStack_19c +
                       fVar89 * fStack_1dc + fVar87 * fVar35 + fVar85 * fStack_1ac + fVar86 * fVar9;
                  fVar84 = *(float *)((long)pvVar63 + lVar55 + 0x10);
                  fVar87 = *(float *)((long)pvVar52 + lVar55 + 0x10);
                  fVar90 = *(float *)((long)pvVar56 + lVar55 + 0x10);
                  *(float *)((long)pvVar68 + -0x30) =
                       fVar86 * local_1b8 + fVar85 * local_1c8 +
                       fVar32 * fVar88 + fVar89 * local_1f8 + *(float *)((long)pvVar68 + -0x30) +
                       fVar14 * fVar28 +
                       fVar13 * local_1e8 + fVar92 * local_1a8 + fVar91 * fVar79 + fVar93 * fVar41;
                  *(float *)((long)pvVar68 + -0x2c) =
                       fVar86 * fStack_1b4 + fVar85 * fStack_1c4 +
                       fVar33 * fVar88 + fVar89 * fStack_1f4 + *(float *)((long)pvVar68 + -0x2c) +
                       fVar14 * fVar29 +
                       fVar13 * fStack_1e4 + fVar92 * fStack_1a4 + fVar91 * fVar80 + fVar93 * fVar7;
                  *(float *)((long)pvVar68 + -0x28) =
                       fVar86 * fStack_1b0 + fVar85 * fStack_1c0 +
                       fVar34 * fVar88 + fVar89 * fStack_1f0 + *(float *)((long)pvVar68 + -0x28) +
                       fVar14 * fVar30 +
                       fVar13 * fStack_1e0 + fVar92 * fStack_1a0 + fVar91 * fVar81 + fVar93 * fVar8;
                  *(float *)((long)pvVar68 + -0x24) =
                       fVar86 * fStack_1ac + fVar85 * fStack_1bc +
                       fVar35 * fVar88 + fVar89 * fStack_1ec + *(float *)((long)pvVar68 + -0x24) +
                       fVar14 * fVar31 +
                       fVar13 * fStack_1dc + fVar92 * fStack_19c + fVar91 * fVar40 + fVar93 * fVar9;
                  fVar85 = *(float *)((long)pvVar63 + lVar55 + 0x14);
                  fVar88 = *(float *)((long)pvVar52 + lVar55 + 0x14);
                  fVar91 = *(float *)((long)pvVar56 + lVar55 + 0x14);
                  *(float *)((long)pvVar68 + -0x20) =
                       fVar13 * local_1f8 + fVar14 * local_1a8 + fVar84 * fVar41 +
                       fVar87 * local_1e8 + fVar90 * fVar28 +
                       fVar92 * fVar79 + fVar93 * local_1b8 + fVar89 * fVar32 + fVar86 * local_1c8 +
                       *(float *)((long)pvVar68 + -0x20);
                  *(float *)((long)pvVar68 + -0x1c) =
                       fVar13 * fStack_1f4 + fVar14 * fStack_1a4 + fVar84 * fVar7 +
                       fVar87 * fStack_1e4 + fVar90 * fVar29 +
                       fVar92 * fVar80 + fVar93 * fVar10 + fVar89 * fVar33 + fVar86 * fStack_1c4 +
                       *(float *)((long)pvVar68 + -0x1c);
                  *(float *)((long)pvVar68 + -0x18) =
                       fVar13 * fStack_1f0 + fVar14 * fStack_1a0 + fVar84 * fVar8 +
                       fVar87 * fStack_1e0 + fVar90 * fVar30 +
                       fVar92 * fVar81 + fVar93 * fVar11 + fVar89 * fVar34 + fVar86 * fStack_1c0 +
                       *(float *)((long)pvVar68 + -0x18);
                  *(float *)((long)pvVar68 + -0x14) =
                       fVar13 * fStack_1ec + fVar14 * fStack_19c + fVar84 * fVar9 +
                       fVar87 * fStack_1dc + fVar90 * fVar31 +
                       fVar92 * fVar40 + fVar93 * fVar36 + fVar89 * fVar35 + fVar86 * fStack_1bc +
                       *(float *)((long)pvVar68 + -0x14);
                  auVar71._0_4_ =
                       fVar32 * fVar13 + fVar93 * local_1c8 + fVar79 * fVar14 + fVar84 * local_1b8 +
                       *(float *)((long)pvVar68 + -0x10) +
                       fVar87 * local_1f8 + fVar90 * local_1a8 + fVar85 * local_218 +
                       fVar88 * local_1e8 + fVar91 * fVar28;
                  auVar71._4_4_ =
                       fVar33 * fVar13 + fVar93 * fStack_1c4 + fVar80 * fVar14 + fVar84 * fVar10 +
                       *(float *)((long)pvVar68 + -0xc) +
                       fVar87 * fStack_1f4 + fVar90 * fStack_1a4 + fVar85 * fVar7 +
                       fVar88 * fStack_1e4 + fVar91 * fVar29;
                  auVar71._8_4_ =
                       fVar34 * fVar13 + fVar93 * fStack_1c0 + fVar81 * fVar14 + fVar84 * fVar11 +
                       *(float *)((long)pvVar68 + -8) +
                       fVar87 * fStack_1f0 + fVar90 * fStack_1a0 + fVar85 * fStack_210 +
                       fVar88 * fStack_1e0 + fVar91 * fVar30;
                  auVar71._12_4_ =
                       fVar35 * fVar13 + fVar93 * fStack_1bc + fVar40 * fVar14 + fVar84 * fVar36 +
                       *(float *)((long)pvVar68 + -4) +
                       fVar87 * fStack_1ec + fVar90 * fStack_19c + fVar85 * fVar9 +
                       fVar88 * fStack_1dc + fVar91 * fVar31;
                  *(undefined1 (*) [16])((long)pvVar68 + -0x10) = auVar71;
                  lVar55 = lVar55 + 0x10;
                  iVar58 = iVar58 + 4;
                } while (iVar58 < (int)uVar21);
                pvVar63 = (void *)((long)pvVar63 + lVar55);
                pvVar52 = (void *)((long)pvVar52 + lVar55);
                pvVar56 = (void *)((long)pvVar56 + lVar55);
                pvVar68 = (void *)((long)pvVar65 + 0x40);
                fVar84 = fVar12;
                fVar85 = fStack_1a4;
                fVar86 = fStack_1a0;
                fVar87 = fStack_19c;
                fVar88 = local_1b8;
                fVar89 = fStack_1b4;
                fVar90 = fStack_1b0;
                fVar91 = fStack_1ac;
                fVar92 = local_218;
                fVar93 = fStack_210;
                uVar54 = uVar21 & 0xfffffffc;
              }
              if ((int)(uVar54 | 1) < (int)uVar21) {
                lVar55 = 0;
                pvVar62 = pvVar68;
                uVar51 = uVar54;
                do {
                  pvVar65 = pvVar62;
                  fVar84 = *(float *)((long)pvVar63 + lVar55);
                  fVar85 = *(float *)((long)pvVar63 + lVar55 + 4);
                  fVar86 = *(float *)((long)pvVar63 + lVar55 + 8);
                  fVar87 = *(float *)((long)pvVar52 + lVar55);
                  fVar88 = *(float *)((long)pvVar52 + lVar55 + 4);
                  fVar89 = *(float *)((long)pvVar52 + lVar55 + 8);
                  fVar90 = *(float *)((long)pvVar56 + lVar55);
                  fVar91 = *(float *)((long)pvVar56 + lVar55 + 4);
                  fVar92 = *(float *)((long)pvVar56 + lVar55 + 8);
                  pvVar62 = (void *)((long)pvVar68 + lVar55 * 4 + 0x20);
                  fVar93 = *(float *)((long)pvVar63 + lVar55 + 0xc);
                  fVar13 = *(float *)((long)pvVar52 + lVar55 + 0xc);
                  fVar14 = *(float *)((long)pvVar56 + lVar55 + 0xc);
                  *(float *)((long)pvVar62 + -0x20) =
                       fVar85 * local_1b8 + fVar86 * local_218 + fVar87 * auVar47._0_4_ +
                       local_1e8 * fVar89 + fVar91 * fVar12 +
                       fVar92 * fVar28 +
                       fVar90 * auVar49._0_4_ +
                       local_1f8 * fVar88 + fVar84 * local_1c8 + *(float *)((long)pvVar62 + -0x20);
                  *(float *)((long)pvVar62 + -0x1c) =
                       fVar85 * fVar10 + fVar86 * fVar7 + fVar87 * auVar47._4_4_ +
                       fStack_1e4 * fVar89 + fVar91 * fStack_1a4 +
                       fVar92 * fVar29 +
                       fVar90 * auVar49._4_4_ +
                       fStack_1f4 * fVar88 + fVar84 * fStack_1c4 + *(float *)((long)pvVar62 + -0x1c)
                  ;
                  *(float *)((long)pvVar62 + -0x18) =
                       fVar85 * fVar11 + fVar86 * fStack_210 + fVar87 * auVar47._8_4_ +
                       fStack_1e0 * fVar89 + fVar91 * fStack_1a0 +
                       fVar92 * fVar30 +
                       fVar90 * auVar49._8_4_ +
                       fStack_1f0 * fVar88 + fVar84 * fStack_1c0 + *(float *)((long)pvVar62 + -0x18)
                  ;
                  *(float *)((long)pvVar62 + -0x14) =
                       fVar85 * fVar36 + fVar86 * fVar9 + fVar87 * fVar35 + fStack_1dc * fVar89 +
                       fVar91 * fStack_19c +
                       fVar92 * fVar31 +
                       fVar90 * fVar40 +
                       fStack_1ec * fVar88 + fVar84 * fStack_1bc + *(float *)((long)pvVar62 + -0x14)
                  ;
                  auVar72._0_4_ =
                       fVar86 * local_1b8 + fVar85 * local_1c8 +
                       local_1f8 * fVar89 + auVar47._0_4_ * fVar88 +
                       *(float *)((long)pvVar62 + -0x10) +
                       auVar49._0_4_ * fVar91 + fVar92 * fVar12 + fVar93 * local_218 +
                       fVar13 * local_1e8 + fVar28 * fVar14;
                  auVar72._4_4_ =
                       fVar86 * fVar10 + fVar85 * fStack_1c4 +
                       fStack_1f4 * fVar89 + auVar47._4_4_ * fVar88 +
                       *(float *)((long)pvVar62 + -0xc) +
                       auVar49._4_4_ * fVar91 + fVar92 * fStack_1a4 + fVar93 * fVar7 +
                       fVar13 * fStack_1e4 + fVar29 * fVar14;
                  auVar72._8_4_ =
                       fVar86 * fVar11 + fVar85 * fStack_1c0 +
                       fStack_1f0 * fVar89 + auVar47._8_4_ * fVar88 + *(float *)((long)pvVar62 + -8)
                       + auVar49._8_4_ * fVar91 + fVar92 * fStack_1a0 + fVar93 * fStack_210 +
                         fVar13 * fStack_1e0 + fVar30 * fVar14;
                  auVar72._12_4_ =
                       fVar86 * fVar36 + fVar85 * fStack_1bc + fStack_1ec * fVar89 + fVar35 * fVar88
                       + *(float *)((long)pvVar62 + -4) +
                       fVar40 * fVar91 + fVar92 * fStack_19c + fVar93 * fVar9 + fVar13 * fStack_1dc
                       + fVar31 * fVar14;
                  *(undefined1 (*) [16])((long)pvVar62 + -0x10) = auVar72;
                  uVar54 = uVar51 + 2;
                  lVar55 = lVar55 + 8;
                  iVar58 = uVar51 + 3;
                  uVar51 = uVar54;
                } while (iVar58 < (int)uVar21);
                pvVar68 = (void *)((long)pvVar65 + 0x20);
                pvVar63 = (void *)((long)pvVar63 + lVar55);
                pvVar52 = (void *)((long)pvVar52 + lVar55);
                pvVar56 = (void *)((long)pvVar56 + lVar55);
                fVar84 = fVar12;
                fVar85 = fStack_1a4;
                fVar86 = fStack_1a0;
                fVar87 = fStack_19c;
                fVar88 = local_1b8;
                fVar89 = fStack_1b4;
                fVar90 = fStack_1b0;
                fVar91 = fStack_1ac;
                fVar92 = local_218;
                fVar93 = fStack_210;
              }
              iVar58 = uVar21 - uVar54;
              pvVar62 = pvVar68;
              if (iVar58 != 0 && (int)uVar54 <= (int)uVar21) {
                lVar55 = 0;
                do {
                  fVar10 = *(float *)((long)pvVar63 + lVar55);
                  fVar11 = *(float *)((long)pvVar63 + lVar55 + 4);
                  fVar12 = *(float *)((long)pvVar63 + lVar55 + 8);
                  fVar13 = *(float *)((long)pvVar52 + lVar55);
                  pfVar3 = (float *)((long)pvVar68 + lVar55 * 4);
                  fVar14 = *(float *)((long)pvVar52 + lVar55 + 4);
                  fVar79 = *(float *)((long)pvVar52 + lVar55 + 8);
                  fVar80 = *(float *)((long)pvVar56 + lVar55);
                  fVar81 = *(float *)((long)pvVar56 + lVar55 + 4);
                  fVar15 = *(float *)((long)pvVar56 + lVar55 + 8);
                  auVar73._0_4_ =
                       local_1c8 * fVar10 + *pfVar3 + local_1f8 * fVar14 + fVar37 * fVar80 +
                       fVar15 * fVar28 +
                       fVar88 * fVar11 + fVar92 * fVar12 + fVar13 * fVar32 + local_1e8 * fVar79 +
                       fVar84 * fVar81;
                  auVar73._4_4_ =
                       fStack_1c4 * fVar10 + pfVar3[1] + fStack_1f4 * fVar14 + fVar38 * fVar80 +
                       fVar15 * fVar29 +
                       fVar89 * fVar11 + fVar7 * fVar12 + fVar13 * fVar33 + fStack_1e4 * fVar79 +
                       fVar85 * fVar81;
                  auVar73._8_4_ =
                       fStack_1c0 * fVar10 + pfVar3[2] + fStack_1f0 * fVar14 + fVar39 * fVar80 +
                       fVar15 * fVar30 +
                       fVar90 * fVar11 + fVar93 * fVar12 + fVar13 * fVar34 + fStack_1e0 * fVar79 +
                       fVar86 * fVar81;
                  auVar73._12_4_ =
                       fStack_1bc * fVar10 + pfVar3[3] + fStack_1ec * fVar14 + fVar40 * fVar80 +
                       fVar15 * fVar31 +
                       fVar91 * fVar11 + fVar9 * fVar12 + fVar13 * fVar35 + fStack_1dc * fVar79 +
                       fVar87 * fVar81;
                  *(undefined1 (*) [16])((long)pvVar68 + lVar55 * 4) = auVar73;
                  pvVar62 = (void *)((long)pvVar62 + 0x10);
                  lVar55 = lVar55 + 4;
                  iVar58 = iVar58 + -1;
                } while (iVar58 != 0);
                pvVar63 = (void *)((long)pvVar63 + lVar55);
                pvVar52 = (void *)((long)pvVar52 + lVar55);
                pvVar56 = (void *)((long)pvVar56 + lVar55);
              }
              pvVar63 = (void *)((long)pvVar63 + 8);
              pvVar52 = (void *)((long)pvVar52 + 8);
              pvVar56 = (void *)((long)pvVar56 + 8);
              iVar57 = iVar57 + 1;
            } while (iVar57 != iVar22);
          }
          pauVar66 = pauVar66 + 9;
          uVar53 = uVar53 + 1;
        } while (uVar53 != uVar20);
      }
      local_1d0 = local_1d0 + 1;
    } while ((long)local_1d0 < (long)iVar23);
  }
  return;
}

Assistant:

static void conv3x3s1_pack1to4_sse(const Mat& bottom_blob, Mat& top_blob, const Mat& kernel, const Mat& _bias, const Option& opt)
{
    int inch = bottom_blob.c;
    int outw = top_blob.w;
    int outh = top_blob.h;
    int outch = top_blob.c;
    const float* bias = _bias;

    int nn_outch = outch >> 1;
    int remain_outch_start = nn_outch << 1;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int pp = 0; pp < nn_outch; pp++)
    {
        int p = pp * 2;

        Mat out0 = top_blob.channel(p);
        Mat out1 = top_blob.channel(p + 1);

        __m128 _bias0 = bias ? _mm_loadu_ps((const float*)bias + p * 4) : _mm_set1_ps(0.f);
        __m128 _bias1 = bias ? _mm_loadu_ps((const float*)bias + (p + 1) * 4) : _mm_set1_ps(0.f);
        out0.fill(_bias0);
        out1.fill(_bias1);

        const float* k0 = kernel.channel(p);
        const float* k1 = kernel.channel(p + 1);

        for (int q = 0; q < inch; q++)
        {
            float* outptr0 = out0;
            float* outptr1 = out1;

            const Mat img0 = bottom_blob.channel(q);

            const float* r0 = img0.row(0);
            const float* r1 = img0.row(1);
            const float* r2 = img0.row(2);

            __m128 _k00_0 = _mm_loadu_ps(k0);
            __m128 _k01_0 = _mm_loadu_ps(k0 + 4);
            __m128 _k02_0 = _mm_loadu_ps(k0 + 8);
            __m128 _k10_0 = _mm_loadu_ps(k0 + 12);
            __m128 _k11_0 = _mm_loadu_ps(k0 + 16);
            __m128 _k12_0 = _mm_loadu_ps(k0 + 20);
            __m128 _k20_0 = _mm_loadu_ps(k0 + 24);
            __m128 _k21_0 = _mm_loadu_ps(k0 + 28);
            __m128 _k22_0 = _mm_loadu_ps(k0 + 32);

            __m128 _k00_1 = _mm_loadu_ps(k1);
            __m128 _k01_1 = _mm_loadu_ps(k1 + 4);
            __m128 _k02_1 = _mm_loadu_ps(k1 + 8);
            __m128 _k10_1 = _mm_loadu_ps(k1 + 12);
            __m128 _k11_1 = _mm_loadu_ps(k1 + 16);
            __m128 _k12_1 = _mm_loadu_ps(k1 + 20);
            __m128 _k20_1 = _mm_loadu_ps(k1 + 24);
            __m128 _k21_1 = _mm_loadu_ps(k1 + 28);
            __m128 _k22_1 = _mm_loadu_ps(k1 + 32);

            int i = 0;

            for (; i < outh; i++)
            {
                int j = 0;
                for (; j + 3 < outw; j += 4)
                {
                    __m128 _sum00 = _mm_loadu_ps(outptr0);
                    __m128 _sum10 = _mm_loadu_ps(outptr1);

                    __m128 _r01 = _mm_set1_ps(*(r0));
                    __m128 _r02 = _mm_set1_ps(*(r0 + 1));
                    __m128 _r03 = _mm_set1_ps(*(r0 + 2));
                    __m128 _r11 = _mm_set1_ps(*(r1));
                    __m128 _r12 = _mm_set1_ps(*(r1 + 1));
                    __m128 _r13 = _mm_set1_ps(*(r1 + 2));
                    __m128 _r21 = _mm_set1_ps(*(r2));
                    __m128 _r22 = _mm_set1_ps(*(r2 + 1));
                    __m128 _r23 = _mm_set1_ps(*(r2 + 2));

                    _sum00 = _mm_comp_fmadd_ps(_r01, _k00_0, _sum00);
                    _sum00 = _mm_comp_fmadd_ps(_r02, _k01_0, _sum00);
                    _sum00 = _mm_comp_fmadd_ps(_r03, _k02_0, _sum00);
                    _sum00 = _mm_comp_fmadd_ps(_r11, _k10_0, _sum00);
                    _sum00 = _mm_comp_fmadd_ps(_r12, _k11_0, _sum00);
                    _sum00 = _mm_comp_fmadd_ps(_r13, _k12_0, _sum00);
                    _sum00 = _mm_comp_fmadd_ps(_r21, _k20_0, _sum00);
                    _sum00 = _mm_comp_fmadd_ps(_r22, _k21_0, _sum00);
                    _sum00 = _mm_comp_fmadd_ps(_r23, _k22_0, _sum00);

                    _sum10 = _mm_comp_fmadd_ps(_r01, _k00_1, _sum10);
                    _sum10 = _mm_comp_fmadd_ps(_r02, _k01_1, _sum10);
                    _sum10 = _mm_comp_fmadd_ps(_r03, _k02_1, _sum10);
                    _sum10 = _mm_comp_fmadd_ps(_r11, _k10_1, _sum10);
                    _sum10 = _mm_comp_fmadd_ps(_r12, _k11_1, _sum10);
                    _sum10 = _mm_comp_fmadd_ps(_r13, _k12_1, _sum10);
                    _sum10 = _mm_comp_fmadd_ps(_r21, _k20_1, _sum10);
                    _sum10 = _mm_comp_fmadd_ps(_r22, _k21_1, _sum10);
                    _sum10 = _mm_comp_fmadd_ps(_r23, _k22_1, _sum10);

                    _mm_storeu_ps(outptr0, _sum00);
                    _mm_storeu_ps(outptr1, _sum10);

                    __m128 _sum01 = _mm_loadu_ps(outptr0 + 4);
                    __m128 _sum11 = _mm_loadu_ps(outptr1 + 4);

                    __m128 _r04 = _mm_set1_ps(*(r0 + 3));
                    __m128 _r14 = _mm_set1_ps(*(r1 + 3));
                    __m128 _r24 = _mm_set1_ps(*(r2 + 3));

                    _sum01 = _mm_comp_fmadd_ps(_r02, _k00_0, _sum01);
                    _sum01 = _mm_comp_fmadd_ps(_r03, _k01_0, _sum01);
                    _sum01 = _mm_comp_fmadd_ps(_r04, _k02_0, _sum01);
                    _sum01 = _mm_comp_fmadd_ps(_r12, _k10_0, _sum01);
                    _sum01 = _mm_comp_fmadd_ps(_r13, _k11_0, _sum01);
                    _sum01 = _mm_comp_fmadd_ps(_r14, _k12_0, _sum01);
                    _sum01 = _mm_comp_fmadd_ps(_r22, _k20_0, _sum01);
                    _sum01 = _mm_comp_fmadd_ps(_r23, _k21_0, _sum01);
                    _sum01 = _mm_comp_fmadd_ps(_r24, _k22_0, _sum01);

                    _sum11 = _mm_comp_fmadd_ps(_r02, _k00_1, _sum11);
                    _sum11 = _mm_comp_fmadd_ps(_r03, _k01_1, _sum11);
                    _sum11 = _mm_comp_fmadd_ps(_r04, _k02_1, _sum11);
                    _sum11 = _mm_comp_fmadd_ps(_r12, _k10_1, _sum11);
                    _sum11 = _mm_comp_fmadd_ps(_r13, _k11_1, _sum11);
                    _sum11 = _mm_comp_fmadd_ps(_r14, _k12_1, _sum11);
                    _sum11 = _mm_comp_fmadd_ps(_r22, _k20_1, _sum11);
                    _sum11 = _mm_comp_fmadd_ps(_r23, _k21_1, _sum11);
                    _sum11 = _mm_comp_fmadd_ps(_r24, _k22_1, _sum11);

                    _mm_storeu_ps(outptr0 + 4, _sum01);
                    _mm_storeu_ps(outptr1 + 4, _sum11);

                    __m128 _sum02 = _mm_loadu_ps(outptr0 + 8);
                    __m128 _sum12 = _mm_loadu_ps(outptr1 + 8);

                    __m128 _r05 = _mm_set1_ps(*(r0 + 4));
                    __m128 _r15 = _mm_set1_ps(*(r1 + 4));
                    __m128 _r25 = _mm_set1_ps(*(r2 + 4));

                    _sum02 = _mm_comp_fmadd_ps(_r03, _k00_0, _sum02);
                    _sum02 = _mm_comp_fmadd_ps(_r04, _k01_0, _sum02);
                    _sum02 = _mm_comp_fmadd_ps(_r05, _k02_0, _sum02);
                    _sum02 = _mm_comp_fmadd_ps(_r13, _k10_0, _sum02);
                    _sum02 = _mm_comp_fmadd_ps(_r14, _k11_0, _sum02);
                    _sum02 = _mm_comp_fmadd_ps(_r15, _k12_0, _sum02);
                    _sum02 = _mm_comp_fmadd_ps(_r23, _k20_0, _sum02);
                    _sum02 = _mm_comp_fmadd_ps(_r24, _k21_0, _sum02);
                    _sum02 = _mm_comp_fmadd_ps(_r25, _k22_0, _sum02);

                    _sum12 = _mm_comp_fmadd_ps(_r03, _k00_1, _sum12);
                    _sum12 = _mm_comp_fmadd_ps(_r04, _k01_1, _sum12);
                    _sum12 = _mm_comp_fmadd_ps(_r05, _k02_1, _sum12);
                    _sum12 = _mm_comp_fmadd_ps(_r13, _k10_1, _sum12);
                    _sum12 = _mm_comp_fmadd_ps(_r14, _k11_1, _sum12);
                    _sum12 = _mm_comp_fmadd_ps(_r15, _k12_1, _sum12);
                    _sum12 = _mm_comp_fmadd_ps(_r23, _k20_1, _sum12);
                    _sum12 = _mm_comp_fmadd_ps(_r24, _k21_1, _sum12);
                    _sum12 = _mm_comp_fmadd_ps(_r25, _k22_1, _sum12);

                    _mm_storeu_ps(outptr0 + 8, _sum02);
                    _mm_storeu_ps(outptr1 + 8, _sum12);

                    __m128 _r06 = _mm_set1_ps(*(r0 + 5));
                    __m128 _r16 = _mm_set1_ps(*(r1 + 5));
                    __m128 _r26 = _mm_set1_ps(*(r2 + 5));

                    __m128 _sum03 = _mm_loadu_ps(outptr0 + 12);
                    __m128 _sum13 = _mm_loadu_ps(outptr1 + 12);

                    _sum03 = _mm_comp_fmadd_ps(_r04, _k00_0, _sum03);
                    _sum03 = _mm_comp_fmadd_ps(_r05, _k01_0, _sum03);
                    _sum03 = _mm_comp_fmadd_ps(_r06, _k02_0, _sum03);
                    _sum03 = _mm_comp_fmadd_ps(_r14, _k10_0, _sum03);
                    _sum03 = _mm_comp_fmadd_ps(_r15, _k11_0, _sum03);
                    _sum03 = _mm_comp_fmadd_ps(_r16, _k12_0, _sum03);
                    _sum03 = _mm_comp_fmadd_ps(_r24, _k20_0, _sum03);
                    _sum03 = _mm_comp_fmadd_ps(_r25, _k21_0, _sum03);
                    _sum03 = _mm_comp_fmadd_ps(_r26, _k22_0, _sum03);

                    _sum13 = _mm_comp_fmadd_ps(_r04, _k00_1, _sum13);
                    _sum13 = _mm_comp_fmadd_ps(_r05, _k01_1, _sum13);
                    _sum13 = _mm_comp_fmadd_ps(_r06, _k02_1, _sum13);
                    _sum13 = _mm_comp_fmadd_ps(_r14, _k10_1, _sum13);
                    _sum13 = _mm_comp_fmadd_ps(_r15, _k11_1, _sum13);
                    _sum13 = _mm_comp_fmadd_ps(_r16, _k12_1, _sum13);
                    _sum13 = _mm_comp_fmadd_ps(_r24, _k20_1, _sum13);
                    _sum13 = _mm_comp_fmadd_ps(_r25, _k21_1, _sum13);
                    _sum13 = _mm_comp_fmadd_ps(_r26, _k22_1, _sum13);

                    _mm_storeu_ps(outptr0 + 12, _sum03);
                    _mm_storeu_ps(outptr1 + 12, _sum13);

                    r0 += 4;
                    r1 += 4;
                    r2 += 4;
                    outptr0 += 16;
                    outptr1 += 16;
                }

                for (; j + 1 < outw; j += 2)
                {
                    __m128 _sum00 = _mm_loadu_ps(outptr0);
                    __m128 _sum10 = _mm_loadu_ps(outptr1);

                    __m128 _r01 = _mm_set1_ps(*(r0));
                    __m128 _r02 = _mm_set1_ps(*(r0 + 1));
                    __m128 _r03 = _mm_set1_ps(*(r0 + 2));
                    __m128 _r11 = _mm_set1_ps(*(r1));
                    __m128 _r12 = _mm_set1_ps(*(r1 + 1));
                    __m128 _r13 = _mm_set1_ps(*(r1 + 2));
                    __m128 _r21 = _mm_set1_ps(*(r2));
                    __m128 _r22 = _mm_set1_ps(*(r2 + 1));
                    __m128 _r23 = _mm_set1_ps(*(r2 + 2));

                    _sum00 = _mm_comp_fmadd_ps(_r01, _k00_0, _sum00);
                    _sum00 = _mm_comp_fmadd_ps(_r02, _k01_0, _sum00);
                    _sum00 = _mm_comp_fmadd_ps(_r03, _k02_0, _sum00);
                    _sum00 = _mm_comp_fmadd_ps(_r11, _k10_0, _sum00);
                    _sum00 = _mm_comp_fmadd_ps(_r12, _k11_0, _sum00);
                    _sum00 = _mm_comp_fmadd_ps(_r13, _k12_0, _sum00);
                    _sum00 = _mm_comp_fmadd_ps(_r21, _k20_0, _sum00);
                    _sum00 = _mm_comp_fmadd_ps(_r22, _k21_0, _sum00);
                    _sum00 = _mm_comp_fmadd_ps(_r23, _k22_0, _sum00);

                    _sum10 = _mm_comp_fmadd_ps(_r01, _k00_1, _sum10);
                    _sum10 = _mm_comp_fmadd_ps(_r02, _k01_1, _sum10);
                    _sum10 = _mm_comp_fmadd_ps(_r03, _k02_1, _sum10);
                    _sum10 = _mm_comp_fmadd_ps(_r11, _k10_1, _sum10);
                    _sum10 = _mm_comp_fmadd_ps(_r12, _k11_1, _sum10);
                    _sum10 = _mm_comp_fmadd_ps(_r13, _k12_1, _sum10);
                    _sum10 = _mm_comp_fmadd_ps(_r21, _k20_1, _sum10);
                    _sum10 = _mm_comp_fmadd_ps(_r22, _k21_1, _sum10);
                    _sum10 = _mm_comp_fmadd_ps(_r23, _k22_1, _sum10);

                    _mm_storeu_ps(outptr0, _sum00);
                    _mm_storeu_ps(outptr1, _sum10);

                    __m128 _sum01 = _mm_loadu_ps(outptr0 + 4);
                    __m128 _sum11 = _mm_loadu_ps(outptr1 + 4);

                    __m128 _r04 = _mm_set1_ps(*(r0 + 3));
                    __m128 _r14 = _mm_set1_ps(*(r1 + 3));
                    __m128 _r24 = _mm_set1_ps(*(r2 + 3));

                    _sum01 = _mm_comp_fmadd_ps(_r02, _k00_0, _sum01);
                    _sum01 = _mm_comp_fmadd_ps(_r03, _k01_0, _sum01);
                    _sum01 = _mm_comp_fmadd_ps(_r04, _k02_0, _sum01);
                    _sum01 = _mm_comp_fmadd_ps(_r12, _k10_0, _sum01);
                    _sum01 = _mm_comp_fmadd_ps(_r13, _k11_0, _sum01);
                    _sum01 = _mm_comp_fmadd_ps(_r14, _k12_0, _sum01);
                    _sum01 = _mm_comp_fmadd_ps(_r22, _k20_0, _sum01);
                    _sum01 = _mm_comp_fmadd_ps(_r23, _k21_0, _sum01);
                    _sum01 = _mm_comp_fmadd_ps(_r24, _k22_0, _sum01);

                    _sum11 = _mm_comp_fmadd_ps(_r02, _k00_1, _sum11);
                    _sum11 = _mm_comp_fmadd_ps(_r03, _k01_1, _sum11);
                    _sum11 = _mm_comp_fmadd_ps(_r04, _k02_1, _sum11);
                    _sum11 = _mm_comp_fmadd_ps(_r12, _k10_1, _sum11);
                    _sum11 = _mm_comp_fmadd_ps(_r13, _k11_1, _sum11);
                    _sum11 = _mm_comp_fmadd_ps(_r14, _k12_1, _sum11);
                    _sum11 = _mm_comp_fmadd_ps(_r22, _k20_1, _sum11);
                    _sum11 = _mm_comp_fmadd_ps(_r23, _k21_1, _sum11);
                    _sum11 = _mm_comp_fmadd_ps(_r24, _k22_1, _sum11);

                    _mm_storeu_ps(outptr0 + 4, _sum01);
                    _mm_storeu_ps(outptr1 + 4, _sum11);

                    r0 += 2;
                    r1 += 2;
                    r2 += 2;
                    outptr0 += 8;
                    outptr1 += 8;
                }

                for (; j < outw; j++)
                {
                    __m128 _sum00 = _mm_loadu_ps(outptr0);
                    __m128 _sum10 = _mm_loadu_ps(outptr1);

                    __m128 _r01 = _mm_set1_ps(*(r0));
                    __m128 _r02 = _mm_set1_ps(*(r0 + 1));
                    __m128 _r03 = _mm_set1_ps(*(r0 + 2));
                    __m128 _r11 = _mm_set1_ps(*(r1));
                    __m128 _r12 = _mm_set1_ps(*(r1 + 1));
                    __m128 _r13 = _mm_set1_ps(*(r1 + 2));
                    __m128 _r21 = _mm_set1_ps(*(r2));
                    __m128 _r22 = _mm_set1_ps(*(r2 + 1));
                    __m128 _r23 = _mm_set1_ps(*(r2 + 2));

                    _sum00 = _mm_comp_fmadd_ps(_r01, _k00_0, _sum00);
                    _sum00 = _mm_comp_fmadd_ps(_r02, _k01_0, _sum00);
                    _sum00 = _mm_comp_fmadd_ps(_r03, _k02_0, _sum00);
                    _sum00 = _mm_comp_fmadd_ps(_r11, _k10_0, _sum00);
                    _sum00 = _mm_comp_fmadd_ps(_r12, _k11_0, _sum00);
                    _sum00 = _mm_comp_fmadd_ps(_r13, _k12_0, _sum00);
                    _sum00 = _mm_comp_fmadd_ps(_r21, _k20_0, _sum00);
                    _sum00 = _mm_comp_fmadd_ps(_r22, _k21_0, _sum00);
                    _sum00 = _mm_comp_fmadd_ps(_r23, _k22_0, _sum00);

                    _sum10 = _mm_comp_fmadd_ps(_r01, _k00_1, _sum10);
                    _sum10 = _mm_comp_fmadd_ps(_r02, _k01_1, _sum10);
                    _sum10 = _mm_comp_fmadd_ps(_r03, _k02_1, _sum10);
                    _sum10 = _mm_comp_fmadd_ps(_r11, _k10_1, _sum10);
                    _sum10 = _mm_comp_fmadd_ps(_r12, _k11_1, _sum10);
                    _sum10 = _mm_comp_fmadd_ps(_r13, _k12_1, _sum10);
                    _sum10 = _mm_comp_fmadd_ps(_r21, _k20_1, _sum10);
                    _sum10 = _mm_comp_fmadd_ps(_r22, _k21_1, _sum10);
                    _sum10 = _mm_comp_fmadd_ps(_r23, _k22_1, _sum10);

                    _mm_storeu_ps(outptr0, _sum00);
                    _mm_storeu_ps(outptr1, _sum10);

                    r0 += 1;
                    r1 += 1;
                    r2 += 1;
                    outptr0 += 4;
                    outptr1 += 4;
                }

                r0 += 2;
                r1 += 2;
                r2 += 2;
            }

            k0 += 9 * 4;
            k1 += 9 * 4;
        }
    }

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = remain_outch_start; p < outch; p++)
    {
        Mat out0 = top_blob.channel(p);

        __m128 _bias0 = bias ? _mm_loadu_ps((const float*)bias + p * 4) : _mm_set1_ps(0.f);
        out0.fill(_bias0);

        const float* k0 = kernel.channel(p);

        for (int q = 0; q < inch; q++)
        {
            float* outptr0 = out0.row(0);

            const Mat img0 = bottom_blob.channel(q);

            const float* r0 = img0.row(0);
            const float* r1 = img0.row(1);
            const float* r2 = img0.row(2);

            __m128 _k00 = _mm_loadu_ps(k0);
            __m128 _k01 = _mm_loadu_ps(k0 + 4);
            __m128 _k02 = _mm_loadu_ps(k0 + 8);
            __m128 _k10 = _mm_loadu_ps(k0 + 12);
            __m128 _k11 = _mm_loadu_ps(k0 + 16);
            __m128 _k12 = _mm_loadu_ps(k0 + 20);
            __m128 _k20 = _mm_loadu_ps(k0 + 24);
            __m128 _k21 = _mm_loadu_ps(k0 + 28);
            __m128 _k22 = _mm_loadu_ps(k0 + 32);

            int i = 0;

            for (; i < outh; i++)
            {
                int j = 0;
                for (; j + 3 < outw; j += 4)
                {
                    __m128 _sum0 = _mm_loadu_ps(outptr0);

                    __m128 _r01 = _mm_set1_ps(*(r0));
                    __m128 _r02 = _mm_set1_ps(*(r0 + 1));
                    __m128 _r03 = _mm_set1_ps(*(r0 + 2));
                    __m128 _r11 = _mm_set1_ps(*(r1));
                    __m128 _r12 = _mm_set1_ps(*(r1 + 1));
                    __m128 _r13 = _mm_set1_ps(*(r1 + 2));
                    __m128 _r21 = _mm_set1_ps(*(r2));
                    __m128 _r22 = _mm_set1_ps(*(r2 + 1));
                    __m128 _r23 = _mm_set1_ps(*(r2 + 2));

                    _sum0 = _mm_comp_fmadd_ps(_r01, _k00, _sum0);
                    _sum0 = _mm_comp_fmadd_ps(_r02, _k01, _sum0);
                    _sum0 = _mm_comp_fmadd_ps(_r03, _k02, _sum0);
                    _sum0 = _mm_comp_fmadd_ps(_r11, _k10, _sum0);
                    _sum0 = _mm_comp_fmadd_ps(_r12, _k11, _sum0);
                    _sum0 = _mm_comp_fmadd_ps(_r13, _k12, _sum0);
                    _sum0 = _mm_comp_fmadd_ps(_r21, _k20, _sum0);
                    _sum0 = _mm_comp_fmadd_ps(_r22, _k21, _sum0);
                    _sum0 = _mm_comp_fmadd_ps(_r23, _k22, _sum0);

                    __m128 _sum1 = _mm_loadu_ps(outptr0 + 4);
                    __m128 _r04 = _mm_set1_ps(*(r0 + 3));
                    __m128 _r14 = _mm_set1_ps(*(r1 + 3));
                    __m128 _r24 = _mm_set1_ps(*(r2 + 3));
                    _mm_storeu_ps(outptr0, _sum0);

                    _sum1 = _mm_comp_fmadd_ps(_r02, _k00, _sum1);
                    _sum1 = _mm_comp_fmadd_ps(_r03, _k01, _sum1);
                    _sum1 = _mm_comp_fmadd_ps(_r04, _k02, _sum1);
                    _sum1 = _mm_comp_fmadd_ps(_r12, _k10, _sum1);
                    _sum1 = _mm_comp_fmadd_ps(_r13, _k11, _sum1);
                    _sum1 = _mm_comp_fmadd_ps(_r14, _k12, _sum1);
                    _sum1 = _mm_comp_fmadd_ps(_r22, _k20, _sum1);
                    _sum1 = _mm_comp_fmadd_ps(_r23, _k21, _sum1);
                    _sum1 = _mm_comp_fmadd_ps(_r24, _k22, _sum1);

                    __m128 _sum2 = _mm_loadu_ps(outptr0 + 8);
                    __m128 _r05 = _mm_set1_ps(*(r0 + 4));
                    __m128 _r15 = _mm_set1_ps(*(r1 + 4));
                    __m128 _r25 = _mm_set1_ps(*(r2 + 4));
                    _mm_storeu_ps(outptr0 + 4, _sum1);

                    _sum2 = _mm_comp_fmadd_ps(_r03, _k00, _sum2);
                    _sum2 = _mm_comp_fmadd_ps(_r04, _k01, _sum2);
                    _sum2 = _mm_comp_fmadd_ps(_r05, _k02, _sum2);
                    _sum2 = _mm_comp_fmadd_ps(_r13, _k10, _sum2);
                    _sum2 = _mm_comp_fmadd_ps(_r14, _k11, _sum2);
                    _sum2 = _mm_comp_fmadd_ps(_r15, _k12, _sum2);
                    _sum2 = _mm_comp_fmadd_ps(_r23, _k20, _sum2);
                    _sum2 = _mm_comp_fmadd_ps(_r24, _k21, _sum2);
                    _sum2 = _mm_comp_fmadd_ps(_r25, _k22, _sum2);

                    __m128 _sum3 = _mm_loadu_ps(outptr0 + 12);
                    __m128 _r06 = _mm_set1_ps(*(r0 + 5));
                    __m128 _r16 = _mm_set1_ps(*(r1 + 5));
                    __m128 _r26 = _mm_set1_ps(*(r2 + 5));
                    _mm_storeu_ps(outptr0 + 8, _sum2);

                    _sum3 = _mm_comp_fmadd_ps(_r04, _k00, _sum3);
                    _sum3 = _mm_comp_fmadd_ps(_r05, _k01, _sum3);
                    _sum3 = _mm_comp_fmadd_ps(_r06, _k02, _sum3);
                    _sum3 = _mm_comp_fmadd_ps(_r14, _k10, _sum3);
                    _sum3 = _mm_comp_fmadd_ps(_r15, _k11, _sum3);
                    _sum3 = _mm_comp_fmadd_ps(_r16, _k12, _sum3);
                    _sum3 = _mm_comp_fmadd_ps(_r24, _k20, _sum3);
                    _sum3 = _mm_comp_fmadd_ps(_r25, _k21, _sum3);
                    _sum3 = _mm_comp_fmadd_ps(_r26, _k22, _sum3);

                    _mm_storeu_ps(outptr0 + 12, _sum3);

                    r0 += 4;
                    r1 += 4;
                    r2 += 4;
                    outptr0 += 16;
                }
                for (; j + 1 < outw; j += 2)
                {
                    __m128 _sum0 = _mm_loadu_ps(outptr0);

                    __m128 _r01 = _mm_set1_ps(*(r0));
                    __m128 _r02 = _mm_set1_ps(*(r0 + 1));
                    __m128 _r03 = _mm_set1_ps(*(r0 + 2));
                    __m128 _r11 = _mm_set1_ps(*(r1));
                    __m128 _r12 = _mm_set1_ps(*(r1 + 1));
                    __m128 _r13 = _mm_set1_ps(*(r1 + 2));
                    __m128 _r21 = _mm_set1_ps(*(r2));
                    __m128 _r22 = _mm_set1_ps(*(r2 + 1));
                    __m128 _r23 = _mm_set1_ps(*(r2 + 2));

                    _sum0 = _mm_comp_fmadd_ps(_r01, _k00, _sum0);
                    _sum0 = _mm_comp_fmadd_ps(_r02, _k01, _sum0);
                    _sum0 = _mm_comp_fmadd_ps(_r03, _k02, _sum0);
                    _sum0 = _mm_comp_fmadd_ps(_r11, _k10, _sum0);
                    _sum0 = _mm_comp_fmadd_ps(_r12, _k11, _sum0);
                    _sum0 = _mm_comp_fmadd_ps(_r13, _k12, _sum0);
                    _sum0 = _mm_comp_fmadd_ps(_r21, _k20, _sum0);
                    _sum0 = _mm_comp_fmadd_ps(_r22, _k21, _sum0);
                    _sum0 = _mm_comp_fmadd_ps(_r23, _k22, _sum0);

                    __m128 _sum1 = _mm_loadu_ps(outptr0 + 4);
                    __m128 _r04 = _mm_set1_ps(*(r0 + 3));
                    __m128 _r14 = _mm_set1_ps(*(r1 + 3));
                    __m128 _r24 = _mm_set1_ps(*(r2 + 3));
                    _mm_storeu_ps(outptr0, _sum0);

                    _sum1 = _mm_comp_fmadd_ps(_r02, _k00, _sum1);
                    _sum1 = _mm_comp_fmadd_ps(_r03, _k01, _sum1);
                    _sum1 = _mm_comp_fmadd_ps(_r04, _k02, _sum1);
                    _sum1 = _mm_comp_fmadd_ps(_r12, _k10, _sum1);
                    _sum1 = _mm_comp_fmadd_ps(_r13, _k11, _sum1);
                    _sum1 = _mm_comp_fmadd_ps(_r14, _k12, _sum1);
                    _sum1 = _mm_comp_fmadd_ps(_r22, _k20, _sum1);
                    _sum1 = _mm_comp_fmadd_ps(_r23, _k21, _sum1);
                    _sum1 = _mm_comp_fmadd_ps(_r24, _k22, _sum1);

                    _mm_storeu_ps(outptr0 + 4, _sum1);

                    r0 += 2;
                    r1 += 2;
                    r2 += 2;
                    outptr0 += 8;
                }
                for (; j < outw; j++)
                {
                    __m128 _sum0 = _mm_loadu_ps(outptr0);

                    __m128 _r01 = _mm_set1_ps(*(r0));
                    __m128 _r02 = _mm_set1_ps(*(r0 + 1));
                    __m128 _r03 = _mm_set1_ps(*(r0 + 2));
                    __m128 _r11 = _mm_set1_ps(*(r1));
                    __m128 _r12 = _mm_set1_ps(*(r1 + 1));
                    __m128 _r13 = _mm_set1_ps(*(r1 + 2));
                    __m128 _r21 = _mm_set1_ps(*(r2));
                    __m128 _r22 = _mm_set1_ps(*(r2 + 1));
                    __m128 _r23 = _mm_set1_ps(*(r2 + 2));

                    _sum0 = _mm_comp_fmadd_ps(_r01, _k00, _sum0);
                    _sum0 = _mm_comp_fmadd_ps(_r02, _k01, _sum0);
                    _sum0 = _mm_comp_fmadd_ps(_r03, _k02, _sum0);
                    _sum0 = _mm_comp_fmadd_ps(_r11, _k10, _sum0);
                    _sum0 = _mm_comp_fmadd_ps(_r12, _k11, _sum0);
                    _sum0 = _mm_comp_fmadd_ps(_r13, _k12, _sum0);
                    _sum0 = _mm_comp_fmadd_ps(_r21, _k20, _sum0);
                    _sum0 = _mm_comp_fmadd_ps(_r22, _k21, _sum0);
                    _sum0 = _mm_comp_fmadd_ps(_r23, _k22, _sum0);

                    _mm_storeu_ps(outptr0, _sum0);
                    r0 += 1;
                    r1 += 1;
                    r2 += 1;
                    outptr0 += 4;
                }

                r0 += 2;
                r1 += 2;
                r2 += 2;
            }

            k0 += 9 * 4;
        }
    }
}